

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcDoorStyle::~IfcDoorStyle(IfcDoorStyle *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &this[-1].super_IfcTypeProduct.super_IfcTypeObject.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.field_0x10 = 0x982dc0;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x90 = 0x982e88;
  this[-1].super_IfcTypeProduct.Tag.ptr.field_2._M_allocated_capacity = 0x982de8;
  *(undefined8 *)&this[-1].super_IfcTypeProduct.Tag.have = 0x982e10;
  this[-1].ParameterTakesPrecedence._M_dataplus._M_p = (pointer)0x982e38;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject = 0x982e60;
  puVar1 = *(undefined1 **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x70;
  if (puVar1 != &(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x80) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x50;
  if (puVar1 != &(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x60) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x30;
  if (puVar1 != &(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x40) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x10;
  if (puVar1 != &(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x20) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)
             &this[-1].super_IfcTypeProduct.super_IfcTypeObject.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.field_0x10,
             &PTR_construction_vtable_24__00982ea0);
  return;
}

Assistant:

IfcDoorStyle() : Object("IfcDoorStyle") {}